

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::anon_unknown_1::AssertionPrinter::print(AssertionPrinter *this)

{
  bool bVar1;
  OfType OVar2;
  Code CVar3;
  char *pcVar4;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40;
  __normal_iterator<Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_20;
  MessageInfo *local_18;
  AssertionPrinter *local_10;
  AssertionPrinter *this_local;
  
  local_10 = this;
  printSourceInfo(this);
  local_20._M_current =
       (MessageInfo *)
       clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                 (&this->messages);
  __gnu_cxx::
  __normal_iterator<Catch::MessageInfo_const*,std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>>
  ::__normal_iterator<Catch::MessageInfo*>
            ((__normal_iterator<Catch::MessageInfo_const*,std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>>
              *)&local_18,&local_20);
  (this->itMessage)._M_current = local_18;
  OVar2 = AssertionResult::getResultType(this->result);
  if (OVar2 != Unknown) {
    if (OVar2 == Ok) {
      pcVar4 = anon_unknown.dwarf_1b2b8b::passedString();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar4,&local_41);
      printResultType(this,BrightGreen,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      printOriginalExpression(this);
      printReconstructedExpression(this);
      bVar1 = AssertionResult::hasExpression(this->result);
      if (!bVar1) {
        printRemainingMessages(this,None);
        return;
      }
      CVar3 = anon_unknown.dwarf_1b2b8b::dimColour();
      printRemainingMessages(this,CVar3);
      return;
    }
    if (OVar2 == Info) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"info",&local_1d9);
      printResultType(this,None,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      printMessage(this);
      CVar3 = anon_unknown.dwarf_1b2b8b::dimColour();
      printRemainingMessages(this,CVar3);
      return;
    }
    if (OVar2 == Warning) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"warning",&local_201);
      printResultType(this,None,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
      printMessage(this);
      CVar3 = anon_unknown.dwarf_1b2b8b::dimColour();
      printRemainingMessages(this,CVar3);
      return;
    }
    if (OVar2 != FailureBit) {
      if (OVar2 == ExpressionFailed) {
        bVar1 = AssertionResult::isOk(this->result);
        if (bVar1) {
          pcVar4 = anon_unknown.dwarf_1b2b8b::failedString();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98," - but was ok",&local_99);
          std::operator+(&local_78,pcVar4,&local_98);
          printResultType(this,BrightGreen,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
          std::allocator<char>::~allocator((allocator<char> *)&local_99);
        }
        else {
          pcVar4 = anon_unknown.dwarf_1b2b8b::failedString();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pcVar4,&local_c1);
          printResultType(this,BrightRed,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        }
        printOriginalExpression(this);
        printReconstructedExpression(this);
        CVar3 = anon_unknown.dwarf_1b2b8b::dimColour();
        printRemainingMessages(this,CVar3);
        return;
      }
      if (OVar2 == ExplicitFailure) {
        pcVar4 = anon_unknown.dwarf_1b2b8b::failedString();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,pcVar4,&local_229);
        printResultType(this,BrightRed,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::allocator<char>::~allocator((allocator<char> *)&local_229);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_250,"explicitly",&local_251);
        printIssue(this,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        std::allocator<char>::~allocator((allocator<char> *)&local_251);
        printRemainingMessages(this,None);
        return;
      }
      if (OVar2 != Exception) {
        if (OVar2 == ThrewException) {
          pcVar4 = anon_unknown.dwarf_1b2b8b::failedString();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,pcVar4,&local_e9);
          printResultType(this,BrightRed,&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_e9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,"unexpected exception with message:",&local_111);
          printIssue(this,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          std::allocator<char>::~allocator((allocator<char> *)&local_111);
          printMessage(this);
          printExpressionWas(this);
          CVar3 = anon_unknown.dwarf_1b2b8b::dimColour();
          printRemainingMessages(this,CVar3);
          return;
        }
        if (OVar2 != DidntThrowException) {
          if (OVar2 != FatalErrorCondition) {
            return;
          }
          pcVar4 = anon_unknown.dwarf_1b2b8b::failedString();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,pcVar4,&local_139)
          ;
          printResultType(this,BrightRed,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          std::allocator<char>::~allocator((allocator<char> *)&local_139);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_160,"fatal error condition with message:",&local_161);
          printIssue(this,&local_160);
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator((allocator<char> *)&local_161);
          printMessage(this);
          printExpressionWas(this);
          CVar3 = anon_unknown.dwarf_1b2b8b::dimColour();
          printRemainingMessages(this,CVar3);
          return;
        }
        pcVar4 = anon_unknown.dwarf_1b2b8b::failedString();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,pcVar4,&local_189);
        printResultType(this,BrightRed,&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        std::allocator<char>::~allocator((allocator<char> *)&local_189);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"expected exception, got none",&local_1b1);
        printIssue(this,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
        printExpressionWas(this);
        CVar3 = anon_unknown.dwarf_1b2b8b::dimColour();
        printRemainingMessages(this,CVar3);
        return;
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"** internal error **",&local_279);
  printResultType(this,BrightRed,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  return;
}

Assistant:

void print() {
        printSourceInfo();

        itMessage = messages.begin();

        switch (result.getResultType()) {
          case ResultWas::Ok:
            printResultType(Colour::ResultSuccess, passedString());
            printOriginalExpression();
            printReconstructedExpression();
            if (!result.hasExpression())
              printRemainingMessages(Colour::None);
            else
              printRemainingMessages();
            break;
          case ResultWas::ExpressionFailed:
            if (result.isOk())
              printResultType(Colour::ResultSuccess, failedString() + std::string(" - but was ok"));
            else
              printResultType(Colour::Error, failedString());
            printOriginalExpression();
            printReconstructedExpression();
            printRemainingMessages();
            break;
          case ResultWas::ThrewException:
            printResultType(Colour::Error, failedString());
            printIssue("unexpected exception with message:");
            printMessage();
            printExpressionWas();
            printRemainingMessages();
            break;
          case ResultWas::FatalErrorCondition:
            printResultType(Colour::Error, failedString());
            printIssue("fatal error condition with message:");
            printMessage();
            printExpressionWas();
            printRemainingMessages();
            break;
          case ResultWas::DidntThrowException:
            printResultType(Colour::Error, failedString());
            printIssue("expected exception, got none");
            printExpressionWas();
            printRemainingMessages();
            break;
          case ResultWas::Info:
            printResultType(Colour::None, "info");
            printMessage();
            printRemainingMessages();
            break;
          case ResultWas::Warning:
            printResultType(Colour::None, "warning");
            printMessage();
            printRemainingMessages();
            break;
          case ResultWas::ExplicitFailure:
            printResultType(Colour::Error, failedString());
            printIssue("explicitly");
            printRemainingMessages(Colour::None);
            break;
          // These cases are here to prevent compiler warnings
          case ResultWas::Unknown:
          case ResultWas::FailureBit:
          case ResultWas::Exception:
            printResultType(Colour::Error, "** internal error **");
            break;
        }
      }